

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

char * ImGui::TableGetColumnName(int column_n)

{
  ImGuiTable *table_00;
  ImGuiTable *table;
  ImGuiContext *g;
  char *pcStack_10;
  int column_n_local;
  
  table_00 = GImGui->CurrentTable;
  if (table_00 == (ImGuiTable *)0x0) {
    pcStack_10 = (char *)0x0;
  }
  else {
    g._4_4_ = column_n;
    if (column_n < 0) {
      g._4_4_ = table_00->CurrentColumn;
    }
    pcStack_10 = TableGetColumnName(table_00,g._4_4_);
  }
  return pcStack_10;
}

Assistant:

const char* ImGui::TableGetColumnName(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return NULL;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return TableGetColumnName(table, column_n);
}